

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O0

int rxa2_blake2b_long(void *pout,size_t outlen,void *in,size_t inlen)

{
  int iVar1;
  ulong in_RSI;
  undefined8 *in_RDI;
  uint8_t in_buffer [64];
  uint8_t out_buffer [64];
  uint32_t toproduce;
  int ret;
  uint8_t outlen_bytes [4];
  blake2b_state blake_state;
  uint8_t *out;
  undefined1 auStackY_1a8 [16];
  size_t in_stack_fffffffffffffe68;
  void *in_stack_fffffffffffffe70;
  blake2b_state *in_stack_fffffffffffffe78;
  size_t in_stack_fffffffffffffe90;
  blake2b_state *in_stack_fffffffffffffe98;
  undefined8 local_160;
  size_t in_stack_fffffffffffffea8;
  void *in_stack_fffffffffffffeb0;
  blake2b_state *in_stack_fffffffffffffeb8;
  uint local_124;
  int local_120;
  undefined1 local_11c [100];
  size_t in_stack_ffffffffffffff48;
  void *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  void *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff70;
  undefined8 *local_28;
  
  memset(local_11c,0,4);
  local_120 = -1;
  if (in_RSI < 0x100000000) {
    local_124 = (uint)in_RSI;
    store32(local_11c,local_124);
    if (in_RSI < 0x41) {
      local_120 = blake2b_init(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      if (((-1 < local_120) &&
          (local_120 = blake2b_update(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                                      in_stack_fffffffffffffe68), -1 < local_120)) &&
         (local_120 = blake2b_update(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                                     in_stack_fffffffffffffe68), -1 < local_120)) {
        local_120 = blake2b_final(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                                  in_stack_fffffffffffffea8);
      }
    }
    else {
      local_120 = blake2b_init(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      if ((((-1 < local_120) &&
           (local_120 = blake2b_update(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                                       in_stack_fffffffffffffe68), -1 < local_120)) &&
          (local_120 = blake2b_update(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                                      in_stack_fffffffffffffe68), -1 < local_120)) &&
         (local_120 = blake2b_final(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                                    in_stack_fffffffffffffea8), -1 < local_120)) {
        *in_RDI = in_stack_fffffffffffffe98;
        in_RDI[1] = local_160;
        in_RDI[2] = in_stack_fffffffffffffea8;
        in_RDI[3] = in_stack_fffffffffffffeb0;
        local_28 = in_RDI + 4;
        while (local_124 = local_124 - 0x20, 0x40 < local_124) {
          memcpy(auStackY_1a8,&stack0xfffffffffffffe98,0x40);
          iVar1 = blake2b(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                          in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                          in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
          if (iVar1 < 0) {
            return iVar1;
          }
          *local_28 = in_stack_fffffffffffffe98;
          local_28[1] = local_160;
          local_28[2] = in_stack_fffffffffffffea8;
          local_28[3] = in_stack_fffffffffffffeb0;
          local_28 = local_28 + 4;
        }
        memcpy(auStackY_1a8,&stack0xfffffffffffffe98,0x40);
        local_120 = blake2b(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                            in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                            in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        if (-1 < local_120) {
          memcpy(local_28,&stack0xfffffffffffffe98,(ulong)local_124);
        }
      }
    }
  }
  return local_120;
}

Assistant:

int rxa2_blake2b_long(void *pout, size_t outlen, const void *in, size_t inlen) {
	uint8_t *out = (uint8_t *)pout;
	blake2b_state blake_state;
	uint8_t outlen_bytes[sizeof(uint32_t)] = { 0 };
	int ret = -1;

	if (outlen > UINT32_MAX) {
		goto fail;
	}

	/* Ensure little-endian byte order! */
	store32(outlen_bytes, (uint32_t)outlen);

#define TRY(statement)                                                         \
    do {                                                                       \
        ret = statement;                                                       \
        if (ret < 0) {                                                         \
            goto fail;                                                         \
        }                                                                      \
    } while ((void)0, 0)

	if (outlen <= BLAKE2B_OUTBYTES) {
		TRY(blake2b_init(&blake_state, outlen));
		TRY(blake2b_update(&blake_state, outlen_bytes, sizeof(outlen_bytes)));
		TRY(blake2b_update(&blake_state, in, inlen));
		TRY(blake2b_final(&blake_state, out, outlen));
	}
	else {
		uint32_t toproduce;
		uint8_t out_buffer[BLAKE2B_OUTBYTES];
		uint8_t in_buffer[BLAKE2B_OUTBYTES];
		TRY(blake2b_init(&blake_state, BLAKE2B_OUTBYTES));
		TRY(blake2b_update(&blake_state, outlen_bytes, sizeof(outlen_bytes)));
		TRY(blake2b_update(&blake_state, in, inlen));
		TRY(blake2b_final(&blake_state, out_buffer, BLAKE2B_OUTBYTES));
		memcpy(out, out_buffer, BLAKE2B_OUTBYTES / 2);
		out += BLAKE2B_OUTBYTES / 2;
		toproduce = (uint32_t)outlen - BLAKE2B_OUTBYTES / 2;

		while (toproduce > BLAKE2B_OUTBYTES) {
			memcpy(in_buffer, out_buffer, BLAKE2B_OUTBYTES);
			TRY(blake2b(out_buffer, BLAKE2B_OUTBYTES, in_buffer,
				BLAKE2B_OUTBYTES, NULL, 0));
			memcpy(out, out_buffer, BLAKE2B_OUTBYTES / 2);
			out += BLAKE2B_OUTBYTES / 2;
			toproduce -= BLAKE2B_OUTBYTES / 2;
		}

		memcpy(in_buffer, out_buffer, BLAKE2B_OUTBYTES);
		TRY(blake2b(out_buffer, toproduce, in_buffer, BLAKE2B_OUTBYTES, NULL,
			0));
		memcpy(out, out_buffer, toproduce);
	}
fail:
	//clear_internal_memory(&blake_state, sizeof(blake_state));
	return ret;
#undef TRY
}